

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O0

void __thiscall extra_x12_Test::TestBody(extra_x12_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  precise_unit pVar3;
  string local_128;
  AssertHelper local_108;
  Message local_100;
  bool local_f1;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar__1;
  string local_d8;
  double local_b8;
  double dStack_b0;
  string local_a8;
  AssertHelper local_88;
  Message local_80;
  bool local_71;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_;
  allocator local_49;
  string local_48;
  undefined1 auStack_28 [8];
  precise_unit unit;
  extra_x12_Test *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"NOT A VALID STRING",&local_49);
  pVar3 = units::x12_unit(&local_48);
  unit.multiplier_ = pVar3._8_8_;
  auStack_28 = (undefined1  [8])pVar3.multiplier_;
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  local_71 = units::is_error((precise_unit *)auStack_28);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_70,&local_71,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)local_70,(AssertionResult *)"is_error(unit)","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x8a6,pcVar2);
    testing::internal::AssertHelper::operator=(&local_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    testing::Message::~Message(&local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d8,"RB",
             (allocator *)
             ((long)&gtest_ar__1.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  pVar3 = units::x12_unit(&local_d8);
  dStack_b0 = pVar3._8_8_;
  local_b8 = pVar3.multiplier_;
  auStack_28 = (undefined1  [8])local_b8;
  unit.multiplier_ = dStack_b0;
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar__1.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_f1 = units::is_error((precise_unit *)auStack_28);
  local_f1 = !local_f1;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_f0,&local_f1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)local_f0,(AssertionResult *)"is_error(unit)","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x8a9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_108,&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  return;
}

Assistant:

TEST(extra, x12)
{
    auto unit = x12_unit("NOT A VALID STRING");
    EXPECT_TRUE(is_error(unit));

    unit = x12_unit("RB");
    EXPECT_FALSE(is_error(unit));
}